

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::
appendToByteArray<QStringBuilder<QStringBuilder<QByteArrayView,char_const(&)[3]>,QByteArrayView>,char_const(&)[3]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
          *b,char param_3)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  size_t sVar4;
  char (*pacVar5) [3];
  char *pcVar6;
  char cVar7;
  long lVar8;
  char *pcVar9;
  qsizetype n;
  long lVar10;
  
  pDVar2 = (a->d).d;
  lVar10 = (a->d).size;
  lVar8 = (b->a).b.m_size;
  lVar3 = (b->a).a.a.m_size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar10);
  }
  lVar10 = lVar8 + lVar3 + lVar10 + 4;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar2->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar8 < lVar10) {
    if (pDVar2 == (Data *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar8 < lVar10) {
      lVar8 = lVar10;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar8)) {
      lVar10 = (a->d).size;
      if (lVar8 < lVar10) {
        lVar8 = lVar10;
      }
      QByteArray::reallocData((longlong)a,(AllocationOption)lVar8);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  pcVar9 = (a->d).ptr + (a->d).size;
  sVar4 = (b->a).a.a.m_size;
  if (sVar4 != 0) {
    memcpy(pcVar9,(b->a).a.a.m_data,sVar4);
  }
  pcVar9 = pcVar9 + sVar4;
  pcVar6 = *(b->a).a.b;
  cVar7 = *pcVar6;
  while (cVar7 != '\0') {
    pcVar6 = pcVar6 + 1;
    *pcVar9 = cVar7;
    pcVar9 = pcVar9 + 1;
    cVar7 = *pcVar6;
  }
  sVar4 = (b->a).b.m_size;
  if (sVar4 != 0) {
    memcpy(pcVar9,(b->a).b.m_data,sVar4);
  }
  pacVar5 = b->b;
  cVar7 = (*pacVar5)[0];
  if (cVar7 != '\0') {
    lVar10 = 0;
    do {
      pcVar9[lVar10 + sVar4] = cVar7;
      cVar7 = (*pacVar5)[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while (cVar7 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}